

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O1

void __thiscall Inferences::Instantiation::registerClause(Instantiation *this,Clause *cl)

{
  Term *this_00;
  bool bVar1;
  uint uVar2;
  size_t i;
  Literal **ppLVar3;
  TermList TVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  Set<Kernel::Term_*,_Lib::DefaultHash> *this_01;
  Stack<Kernel::Term_*> *val;
  long lVar7;
  TermList *result;
  void **head;
  uint uVar8;
  bool dummy;
  TermList sort;
  SubtermIterator it;
  bool local_a9;
  TermList local_a8;
  Term *local_a0;
  uint local_94;
  _func_int **local_90;
  DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_88;
  Instantiation *local_80;
  DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_78;
  FixedSizeAllocator<32UL> *local_70;
  FixedSizeAllocator<48UL> *local_68;
  Literal **local_60;
  SubtermIterator local_58;
  
  local_94 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (local_94 != 0) {
    ppLVar3 = cl->_literals;
    local_78 = &this->sorted_candidates;
    local_88 = &this->sorted_candidates_check;
    local_68 = (FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
    local_70 = (FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48);
    local_90 = (_func_int **)&PTR__SubtermIterator_00b69868;
    local_80 = this;
    local_60 = ppLVar3;
    uVar8 = (uint)(local_94 != 0);
    do {
      Kernel::SubtermIterator::SubtermIterator(&local_58,&(*ppLVar3)->super_Term);
      while (bVar1 = Kernel::SubtermIterator::hasNext(&local_58), bVar1) {
        local_58._used = true;
        this_00 = (Term *)**(undefined8 **)
                            (*(long *)((long)local_58._stack._self._M_t.
                                             super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                             .
                                             super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                             ._M_head_impl + 0x10) + -8);
        if ((((ulong)this_00 & 3) == 0) && (uVar2 = Kernel::Term::numVarOccs(this_00), uVar2 == 0))
        {
          local_a8._content = 2;
          bVar1 = Kernel::SortHelper::tryGetResultSort
                            ((SortHelper *)this_00,(TermList)&local_a8,result);
          if ((bVar1) &&
             (TVar4 = Kernel::AtomicSort::defaultSort(), local_a8._content != TVar4._content)) {
            if (((local_80->sorted_candidates)._size == 0) ||
               (pEVar5 = ::Lib::
                         DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                         ::findEntry(local_78,&local_a8), pEVar5 == (Entry *)0x0)) {
              this_01 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                        ::Lib::FixedSizeAllocator<48UL>::alloc(local_68);
              this_01->_capacity = 0;
              this_01->_nonemptyCells = 0;
              this_01->_size = 0;
              this_01->_entries = (Cell *)0x0;
              ::Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand(this_01);
              val = (Stack<Kernel::Term_*> *)::Lib::FixedSizeAllocator<32UL>::alloc(local_70);
              val->_cursor = (Term **)0x0;
              val->_end = (Term **)0x0;
              val->_capacity = 0;
              val->_stack = (Term **)0x0;
              ::Lib::
              DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::insert(local_78,local_a8,val);
              ::Lib::
              DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::insert(local_88,local_a8,this_01);
            }
            else {
              val = pEVar5->_val;
              pEVar6 = ::Lib::
                       DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                       ::findEntry(local_88,&local_a8);
              if (pEVar6 == (Entry *)0x0) {
                this_01 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
              }
              else {
                this_01 = pEVar6->_val;
              }
            }
            bVar1 = ::Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::contains(this_01,this_00);
            if (!bVar1) {
              local_a0 = this_00;
              uVar2 = 0x811c9dc5;
              lVar7 = 0;
              do {
                uVar2 = (*(byte *)((long)&local_a0 + lVar7) ^ uVar2) * 0x1000193;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 8);
              ::Lib::Set<Kernel::Term*,Lib::DefaultHash>::
              rawFindOrInsert<Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda(auto:1)_1_>
                        ((Set<Kernel::Term*,Lib::DefaultHash> *)this_01,
                         (anon_class_8_1_ba1d8281)&local_a0,uVar2,(anon_class_8_1_ba1d8281)&local_a0
                         ,&local_a9);
              if (val->_cursor == val->_end) {
                ::Lib::Stack<Kernel::Term_*>::expand(val);
              }
              *val->_cursor = this_00;
              val->_cursor = val->_cursor + 1;
            }
          }
        }
      }
      local_58.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore = local_90;
      ::Lib::
      Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_58._stack);
      ppLVar3 = local_60 + (int)uVar8;
      bVar1 = uVar8 < local_94;
      uVar8 = (uVar8 < local_94) + uVar8;
    } while (bVar1);
  }
  return;
}

Assistant:

void Instantiation::registerClause(Clause* cl)
{
  ASS(cl);

  //cout << "register " << cl->toString() << endl;

  for (Literal* lit : cl->iterLits()) {
    SubtermIterator it(lit);
    while(it.hasNext()){
      TermList t = it.next();
      if(t.isTerm() && t.term()->ground()){
        TermList sort;
        if(SortHelper::tryGetResultSort(t,sort)){
          if(sort==AtomicSort::defaultSort()) continue;
          Set<Term*>* cans_check=0;
          Stack<Term*>* cans=0;
          if(sorted_candidates.isEmpty() || !sorted_candidates.find(sort,cans)){
            cans_check = new Set<Term*>();
            cans = new Stack<Term*>();
            sorted_candidates.insert(sort,cans);
            sorted_candidates_check.insert(sort,cans_check);
          }
          else{ ALWAYS(sorted_candidates_check.find(sort,cans_check)); }
          ASS(cans_check && cans);
          // cout << "For sort " << sort << " there are " << cans->size() << " cans" <<endl;
          if(!cans_check->contains(t.term())){
            cans_check->insert(t.term());
            cans->push(t.term());
          }
        }
      }
    }
  }

}